

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

VP8StatusCode IDecCheckStatus(WebPIDecoder *idec)

{
  WebPIDecoder *idec_local;
  VP8StatusCode local_4;
  
  if (idec->state_ == STATE_ERROR) {
    local_4 = VP8_STATUS_BITSTREAM_ERROR;
  }
  else if (idec->state_ == STATE_DONE) {
    local_4 = VP8_STATUS_OK;
  }
  else {
    local_4 = VP8_STATUS_SUSPENDED;
  }
  return local_4;
}

Assistant:

static VP8StatusCode IDecCheckStatus(const WebPIDecoder* const idec) {
  assert(idec);
  if (idec->state_ == STATE_ERROR) {
    return VP8_STATUS_BITSTREAM_ERROR;
  }
  if (idec->state_ == STATE_DONE) {
    return VP8_STATUS_OK;
  }
  return VP8_STATUS_SUSPENDED;
}